

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

void __thiscall leveldb::MemTable::MemTable(MemTable *this,InternalKeyComparator *comparator)

{
  Arena *in_RCX;
  long in_FS_OFFSET;
  KeyComparator cmp;
  Comparator local_30;
  Comparator *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->comparator_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_00b3e360;
  (this->comparator_).comparator.user_comparator_ = comparator->user_comparator_;
  this->refs_ = 0;
  Arena::Arena(&this->arena_);
  local_30._vptr_Comparator = (_func_int **)&PTR__Comparator_00b3e360;
  local_28 = (this->comparator_).comparator.user_comparator_;
  cmp.comparator.user_comparator_ = (Comparator *)&this->arena_;
  cmp.comparator.super_Comparator._vptr_Comparator = (_func_int **)&local_30;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList(&this->table_,cmp,in_RCX);
  Comparator::~Comparator(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

MemTable::MemTable(const InternalKeyComparator& comparator)
    : comparator_(comparator), refs_(0), table_(comparator_, &arena_) {}